

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_edit_string(nk_context *ctx,nk_flags flags,char *memory,int *len,int max,
                       nk_plugin_filter filter)

{
  uint uVar1;
  nk_window *pnVar2;
  int iVar3;
  int local_68;
  int local_64;
  nk_plugin_filter local_60;
  nk_window *win;
  nk_text_edit *edit;
  nk_flags state;
  nk_hash hash;
  nk_plugin_filter filter_local;
  int max_local;
  int *len_local;
  char *memory_local;
  nk_flags flags_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5a89,
                  "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
                 );
  }
  if (memory != (char *)0x0) {
    if (len != (int *)0x0) {
      if (((ctx == (nk_context *)0x0) || (memory == (char *)0x0)) || (len == (int *)0x0)) {
        ctx_local._4_4_ = 0;
      }
      else {
        local_60 = filter;
        if (filter == (nk_plugin_filter)0x0) {
          local_60 = nk_filter_default;
        }
        pnVar2 = ctx->current;
        uVar1 = (pnVar2->edit).seq;
        nk_textedit_clear_state(&ctx->text_edit,(uint)((flags & 0x400) != 0),local_60);
        if (((pnVar2->edit).active == 0) || (uVar1 != (pnVar2->edit).name)) {
          (ctx->text_edit).active = '\0';
        }
        else {
          if ((flags & 0x10) == 0) {
            (ctx->text_edit).cursor = (pnVar2->edit).cursor;
          }
          else {
            iVar3 = nk_utf_len(memory,*len);
            (ctx->text_edit).cursor = iVar3;
          }
          if ((flags & 0x20) == 0) {
            (ctx->text_edit).select_start = (pnVar2->edit).cursor;
            (ctx->text_edit).select_end = (pnVar2->edit).cursor;
          }
          else {
            (ctx->text_edit).select_start = (pnVar2->edit).sel_start;
            (ctx->text_edit).select_end = (pnVar2->edit).sel_end;
          }
          (ctx->text_edit).mode = (pnVar2->edit).mode;
          (ctx->text_edit).scrollbar.x = (float)(pnVar2->edit).scrollbar.x;
          (ctx->text_edit).scrollbar.y = (float)(pnVar2->edit).scrollbar.y;
          (ctx->text_edit).active = '\x01';
        }
        local_64 = max;
        if (max < 2) {
          local_64 = 1;
        }
        if (*len < local_64 + -1) {
          local_68 = *len;
        }
        else {
          local_68 = local_64 + -1;
        }
        *len = local_68;
        nk_str_init_fixed(&(ctx->text_edit).string,memory,(long)local_64);
        (ctx->text_edit).string.buffer.allocated = (long)*len;
        iVar3 = nk_utf_len(memory,*len);
        (ctx->text_edit).string.len = iVar3;
        ctx_local._4_4_ = nk_edit_buffer(ctx,flags,&ctx->text_edit,local_60);
        *len = (int)(ctx->text_edit).string.buffer.allocated;
        if ((ctx->text_edit).active != '\0') {
          (pnVar2->edit).cursor = (ctx->text_edit).cursor;
          (pnVar2->edit).sel_start = (ctx->text_edit).select_start;
          (pnVar2->edit).sel_end = (ctx->text_edit).select_end;
          (pnVar2->edit).mode = (ctx->text_edit).mode;
          (pnVar2->edit).scrollbar.x = (nk_uint)(long)(ctx->text_edit).scrollbar.x;
          (pnVar2->edit).scrollbar.y = (nk_uint)(long)(ctx->text_edit).scrollbar.y;
        }
      }
      return ctx_local._4_4_;
    }
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5a8b,
                  "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
                 );
  }
  __assert_fail("memory",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x5a8a,
                "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
               );
}

Assistant:

NK_API nk_flags
nk_edit_string(struct nk_context *ctx, nk_flags flags,
    char *memory, int *len, int max, nk_plugin_filter filter)
{
    nk_hash hash;
    nk_flags state;
    struct nk_text_edit *edit;
    struct nk_window *win;

    NK_ASSERT(ctx);
    NK_ASSERT(memory);
    NK_ASSERT(len);
    if (!ctx || !memory || !len)
        return 0;

    filter = (!filter) ? nk_filter_default: filter;
    win = ctx->current;
    hash = win->edit.seq;
    edit = &ctx->text_edit;
    nk_textedit_clear_state(&ctx->text_edit, (flags & NK_EDIT_MULTILINE)?
        NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE, filter);

    if (win->edit.active && hash == win->edit.name) {
        if (flags & NK_EDIT_NO_CURSOR)
            edit->cursor = nk_utf_len(memory, *len);
        else edit->cursor = win->edit.cursor;
        if (!(flags & NK_EDIT_SELECTABLE)) {
            edit->select_start = win->edit.cursor;
            edit->select_end = win->edit.cursor;
        } else {
            edit->select_start = win->edit.sel_start;
            edit->select_end = win->edit.sel_end;
        }
        edit->mode = win->edit.mode;
        edit->scrollbar.x = (float)win->edit.scrollbar.x;
        edit->scrollbar.y = (float)win->edit.scrollbar.y;
        edit->active = nk_true;
    } else edit->active = nk_false;

    max = NK_MAX(1, max);
    *len = NK_MIN(*len, max-1);
    nk_str_init_fixed(&edit->string, memory, (nk_size)max);
    edit->string.buffer.allocated = (nk_size)*len;
    edit->string.len = nk_utf_len(memory, *len);
    state = nk_edit_buffer(ctx, flags, edit, filter);
    *len = (int)edit->string.buffer.allocated;

    if (edit->active) {
        win->edit.cursor = edit->cursor;
        win->edit.sel_start = edit->select_start;
        win->edit.sel_end = edit->select_end;
        win->edit.mode = edit->mode;
        win->edit.scrollbar.x = (nk_uint)edit->scrollbar.x;
        win->edit.scrollbar.y = (nk_uint)edit->scrollbar.y;
    } return state;
}